

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void __thiscall CChat::OnMessage(CChat *this,int MsgType,void *pRawMsg)

{
  int iVar1;
  undefined8 uVar2;
  char *fmt;
  
  if (MsgType == 0x26) {
    iVar1 = CCommandManager::RemoveCommand(&this->m_CommandManager,*pRawMsg);
    if (iVar1 == 0) {
      uVar2 = *pRawMsg;
      fmt = "removed chat command: name=\'%s\'";
      goto LAB_0012e846;
    }
  }
  else {
    if (MsgType == 0x25) {
      iVar1 = CCommandManager::AddCommand
                        (&this->m_CommandManager,*pRawMsg,*(char **)((long)pRawMsg + 0x10),
                         *(char **)((long)pRawMsg + 8),ServerCommandCallback,this);
      uVar2 = *pRawMsg;
      if (iVar1 == 0) {
        dbg_msg("chat_commands","adding server chat command: name=\'%s\' args=\'%s\' help=\'%s\'",
                uVar2,*(undefined8 *)((long)pRawMsg + 8),*(undefined8 *)((long)pRawMsg + 0x10));
        return;
      }
      fmt = "failed to add command \'%s\'";
LAB_0012e846:
      dbg_msg("chat_commands",fmt,uVar2);
      return;
    }
    if ((MsgType == 3) &&
       ((*pRawMsg != 3 || (((this->super_CComponent).m_pClient)->m_pConfig->m_ClDisableWhisper == 0)
        ))) {
      AddLine(this,*(char **)((long)pRawMsg + 0x10),*(int *)((long)pRawMsg + 4),*pRawMsg,
              *(int *)((long)pRawMsg + 8));
      return;
    }
  }
  return;
}

Assistant:

void CChat::OnMessage(int MsgType, void *pRawMsg)
{
	if(MsgType == NETMSGTYPE_SV_CHAT)
	{
		CNetMsg_Sv_Chat *pMsg = (CNetMsg_Sv_Chat *)pRawMsg;
		if(pMsg->m_Mode == CHAT_WHISPER && Config()->m_ClDisableWhisper)
			return;
		AddLine(pMsg->m_pMessage, pMsg->m_ClientID, pMsg->m_Mode, pMsg->m_TargetID);
	}
	else if(MsgType == NETMSGTYPE_SV_COMMANDINFO)
	{
		CNetMsg_Sv_CommandInfo *pMsg = (CNetMsg_Sv_CommandInfo *)pRawMsg;
		if(!m_CommandManager.AddCommand(pMsg->m_Name, pMsg->m_HelpText, pMsg->m_ArgsFormat, ServerCommandCallback, this))
			dbg_msg("chat_commands", "adding server chat command: name='%s' args='%s' help='%s'", pMsg->m_Name, pMsg->m_ArgsFormat, pMsg->m_HelpText);
		else
			dbg_msg("chat_commands", "failed to add command '%s'", pMsg->m_Name);

	}
	else if(MsgType == NETMSGTYPE_SV_COMMANDINFOREMOVE)
	{
		CNetMsg_Sv_CommandInfoRemove *pMsg = (CNetMsg_Sv_CommandInfoRemove *)pRawMsg;

		if(!m_CommandManager.RemoveCommand(pMsg->m_Name))
		{
			dbg_msg("chat_commands", "removed chat command: name='%s'", pMsg->m_Name);
		}
	}
}